

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O1

void __thiscall
glcts::ShaderBitfieldOperationCaseBitfieldInsertUint::~ShaderBitfieldOperationCaseBitfieldInsertUint
          (ShaderBitfieldOperationCaseBitfieldInsertUint *this)

{
  ShaderBitfieldOperationCase::~ShaderBitfieldOperationCase
            (&this->super_ShaderBitfieldOperationCase);
  operator_delete(this,0x178);
  return;
}

Assistant:

ShaderBitfieldOperationCaseBitfieldInsertUint(Context& context, const char* name, glu::GLSLVersion glslVersion,
												  Data const& data, Data const& insert, int offset, int bits,
												  int components, char const* testStatement)
		: ShaderBitfieldOperationCase(context, name, "", glslVersion, data, testStatement), m_components(components)
	{
		for (int i = 0; i < components; ++i)
		{
			m_data.in2Uvec4[i] = insert.inUvec4[i];
		}
		if (offset + bits > 32)
		{
			offset -= (offset + bits) - 32;
		}
		m_data.offset = offset;
		m_data.bits   = bits;
	}